

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::TextureUnitCase::deinit(TextureUnitCase *this)

{
  Texture3D *this_00;
  pointer ppTVar1;
  TextureCube *this_01;
  pointer ppTVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  
  for (ppTVar3 = (this->m_textures2d).
                 super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar3 !=
      (this->m_textures2d).super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    this_00 = (Texture3D *)*ppTVar3;
    if (this_00 != (Texture3D *)0x0) {
      tcu::Texture3D::~Texture3D(this_00);
    }
    operator_delete(this_00,0x50);
  }
  ppTVar1 = (this->m_textures2d).
            super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar3 != ppTVar1) {
    (this->m_textures2d).super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  }
  for (ppTVar4 = (this->m_texturesCube).
                 super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppTVar4 !=
      (this->m_texturesCube).
      super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar4 = ppTVar4 + 1) {
    this_01 = *ppTVar4;
    if (this_01 != (TextureCube *)0x0) {
      tcu::TextureCube::~TextureCube(this_01);
    }
    operator_delete(this_01,0x168);
  }
  ppTVar2 = (this->m_texturesCube).
            super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != ppTVar2) {
    (this->m_texturesCube).
    super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar2;
  }
  if (this->m_shader != (MultiTexShader *)0x0) {
    (*(this->m_shader->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])();
  }
  this->m_shader = (MultiTexShader *)0x0;
  return;
}

Assistant:

void TextureUnitCase::deinit (void)
{
	for (vector<tcu::Texture2D*>::iterator i = m_textures2d.begin(); i != m_textures2d.end(); i++)
		delete *i;
	m_textures2d.clear();

	for (vector<tcu::TextureCube*>::iterator i = m_texturesCube.begin(); i != m_texturesCube.end(); i++)
		delete *i;
	m_texturesCube.clear();

	delete m_shader;
	m_shader = DE_NULL;
}